

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void duckdb::HistogramBinFunction::
     Combine<duckdb::HistogramBinState<float>,duckdb::HistogramBinFunction>
               (HistogramBinState<float> *source,HistogramBinState<float> *target,
               AggregateInputData *input_data)

{
  unsafe_vector<float> *puVar1;
  unsafe_vector<float> *puVar2;
  float *pfVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  float *pfVar7;
  NotImplementedException *this;
  vector<float,_std::allocator<float>_> *this_00;
  unsafe_vector<idx_t> *puVar8;
  InternalException *this_01;
  long lVar9;
  float *pfVar10;
  long lVar11;
  bool bVar12;
  string local_48;
  
  puVar1 = source->bin_boundaries;
  if (puVar1 == (unsafe_vector<float> *)0x0) {
    return;
  }
  puVar2 = target->bin_boundaries;
  if (puVar2 == (unsafe_vector<float> *)0x0) {
    this_00 = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
    (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    target->bin_boundaries = (unsafe_vector<float> *)this_00;
    puVar8 = (unsafe_vector<idx_t> *)operator_new(0x18);
    (puVar8->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (puVar8->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (puVar8->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    target->counts = puVar8;
    ::std::vector<float,_std::allocator<float>_>::operator=
              (this_00,&source->bin_boundaries->super_vector<float,_std::allocator<float>_>);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               &source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    return;
  }
  pfVar7 = (puVar2->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pfVar3 = (puVar2->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pfVar10 = (puVar1->super_vector<float,_std::allocator<float>_>).
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if ((long)pfVar3 - (long)pfVar7 ==
      (long)(puVar1->super_vector<float,_std::allocator<float>_>).
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish - (long)pfVar10) {
    bVar12 = pfVar7 == pfVar3;
    if (bVar12) {
LAB_01ad94df:
      if (bVar12) {
        puVar4 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar5 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar9 = (long)puVar5 - (long)puVar4;
        puVar6 = (source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (lVar9 != (long)(source->counts->
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar6) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,
                     "Histogram combine - bin boundaries are the same but counts are different","");
          InternalException::InternalException(this_01,&local_48);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (puVar5 == puVar4) {
          return;
        }
        lVar9 = lVar9 >> 3;
        lVar11 = 0;
        do {
          puVar4[lVar11] = puVar4[lVar11] + puVar6[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar11);
        return;
      }
    }
    else if ((*pfVar7 == *pfVar10) && (!NAN(*pfVar7) && !NAN(*pfVar10))) {
      do {
        pfVar10 = pfVar10 + 1;
        pfVar7 = pfVar7 + 1;
        bVar12 = pfVar7 == pfVar3;
        if (bVar12) goto LAB_01ad94df;
      } while ((*pfVar7 == *pfVar10) && (!NAN(*pfVar7) && !NAN(*pfVar10)));
    }
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Histogram - cannot combine histograms with different bin boundaries. Bin boundaries must be the same for all histograms within the same group"
             ,"");
  NotImplementedException::NotImplementedException(this,&local_48);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.bin_boundaries) {
			// nothing to combine
			return;
		}
		if (!target.bin_boundaries) {
			// target does not have bin boundaries - copy everything over
			target.bin_boundaries = new unsafe_vector<typename STATE::TYPE>();
			target.counts = new unsafe_vector<idx_t>();
			*target.bin_boundaries = *source.bin_boundaries;
			*target.counts = *source.counts;
		} else {
			// both source and target have bin boundaries
			if (*target.bin_boundaries != *source.bin_boundaries) {
				throw NotImplementedException(
				    "Histogram - cannot combine histograms with different bin boundaries. "
				    "Bin boundaries must be the same for all histograms within the same group");
			}
			if (target.counts->size() != source.counts->size()) {
				throw InternalException("Histogram combine - bin boundaries are the same but counts are different");
			}
			D_ASSERT(target.counts->size() == source.counts->size());
			for (idx_t bin_idx = 0; bin_idx < target.counts->size(); bin_idx++) {
				(*target.counts)[bin_idx] += (*source.counts)[bin_idx];
			}
		}
	}